

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

void __thiscall md::Code::resolve_branches(Code *this)

{
  bool bVar1;
  short sVar2;
  size_type sVar3;
  mapped_type_conflict1 *pmVar4;
  LandstalkerException *this_00;
  reference pvVar5;
  reference puVar6;
  uint local_14c;
  iterator iStack_148;
  uint32_t addr;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1_1;
  value_type_conflict local_121;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_118;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  const_iterator local_108;
  uchar *local_100;
  value_type_conflict local_f1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  const_iterator local_e0;
  undefined2 local_d6;
  short local_d4;
  undefined1 local_d1;
  undefined1 local_d0 [2];
  uint16_t truncated_offset_as_word;
  int16_t truncated_offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_6c;
  mapped_type_conflict1 local_68;
  int32_t offset;
  uint32_t label_address;
  key_type *local_58;
  type *label;
  type *branch_address;
  _Self local_40;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> branches_to_clean;
  Code *this_local;
  
  branches_to_clean.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
  __end1 = std::
           map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->_pending_branches);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->_pending_branches);
  do {
    bVar1 = std::operator==(&__end1,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      iStack_148 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          (&__end1_1,&stack0xfffffffffffffeb8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end1_1);
        local_14c = *puVar6;
        std::
        map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(&this->_pending_branches,&local_14c);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end1_1);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range1);
      return;
    }
    branch_address =
         &std::
          _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator*(&__end1)->first;
    label = (type *)std::get<0ul,unsigned_int_const,std::__cxx11::string>
                              ((pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)branch_address);
    local_58 = std::get<1ul,unsigned_int_const,std::__cxx11::string>
                         ((pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)branch_address);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::count(&this->_labels,local_58);
    if (sVar3 != 0) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&this->_labels,local_58);
      local_68 = *pmVar4;
      local_6c = local_68 - *(int *)&(label->_M_dataplus)._M_p;
      if ((0x7fff < local_6c) || (local_6c < -0x7fff)) {
        local_d1 = 1;
        this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string((string *)local_d0,*(uint *)&(label->_M_dataplus)._M_p);
        std::operator+(&local_b0,"Offset for branch at byte ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
        std::operator+(&local_90,&local_b0," is too big (cannot be expressed as word)");
        LandstalkerException::LandstalkerException(this_00,&local_90);
        local_d1 = 0;
        __cxa_throw(this_00,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      sVar2 = (short)local_68 - (short)*(undefined4 *)&(label->_M_dataplus)._M_p;
      local_d6 = sVar2;
      local_d4 = sVar2;
      if ((sVar2 < 0x80) && (-0x80 < sVar2)) {
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->_bytes,(ulong)*(uint *)&(label->_M_dataplus)._M_p - 1);
        *pvVar5 = *pvVar5 + (char)sVar2;
      }
      else {
        local_f0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (&this->_bytes);
        local_e8 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_f0,(ulong)*(uint *)&(label->_M_dataplus)._M_p);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_e0,&local_e8);
        local_f1 = local_d6._1_1_;
        local_100 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                                       (&this->_bytes,local_e0,&local_f1);
        local_120._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (&this->_bytes);
        local_118 = __gnu_cxx::
                    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_120,(ulong)*(uint *)&(label->_M_dataplus)._M_p);
        local_110 = __gnu_cxx::
                    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_118,1);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_108,&local_110);
        local_121 = (value_type_conflict)local_d6;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                  (&this->_bytes,local_108,&local_121);
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&__range1,(uint *)label);
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void Code::resolve_branches()
{
    std::vector<uint32_t> branches_to_clean;

    for (auto& [branch_address, label] : _pending_branches)
    {
        if (_labels.count(label))
        {
            uint32_t label_address = _labels[label];
            int32_t offset = (int32_t)(label_address - branch_address);
            if(offset > 0x7FFF || offset < -0x7FFF)
            {
                throw LandstalkerException("Offset for branch at byte " + std::to_string(branch_address) +
                                           " is too big (cannot be expressed as word)");
            }

            int16_t truncated_offset = (int16_t)(label_address - branch_address);
            uint16_t truncated_offset_as_word = static_cast<uint16_t>(truncated_offset);
            if (truncated_offset > 0x7F || truncated_offset < -0x7F)
            {
                // Branch offset is more than one byte long, we need to add an optional displacement
                _bytes.insert(_bytes.begin() + branch_address, static_cast<uint8_t>(truncated_offset_as_word >> 8));
                _bytes.insert(_bytes.begin() + branch_address + 1, static_cast<uint8_t>(truncated_offset_as_word & 0x00FF));
            }
            else
            {
                // Branch offset is less than one byte long, we only need to increment opcode by the offset value
                _bytes[static_cast<size_t>(branch_address) - 1] += truncated_offset_as_word;
            }

            branches_to_clean.emplace_back(branch_address);
        }
    }

    for (uint32_t addr : branches_to_clean)
        _pending_branches.erase(addr);
}